

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplyimpl.cpp
# Opt level: O1

void __thiscall QNetworkReplyImplPrivate::_q_copyReadyRead(QNetworkReplyImplPrivate *this)

{
  QNetworkReply *this_00;
  QIODevice *pQVar1;
  char cVar2;
  long lVar3;
  longlong lVar4;
  long lVar5;
  _Storage<long_long,_true> _t2;
  long lVar6;
  long in_FS_OFFSET;
  QByteArrayView QVar7;
  optional<long_long> oVar8;
  QByteArrayView value;
  pair<QByteArray,_QByteArray> *local_38;
  
  local_38 = *(pair<QByteArray,_QByteArray> **)(in_FS_OFFSET + 0x28);
  if ((this->state == Working) && (this->copyDevice != (QIODevice *)0x0)) {
    this_00 = *(QNetworkReply **)&(this->super_QNetworkReplyPrivate).field_0x8;
    cVar2 = QIODevice::isOpen();
    if (cVar2 != '\0') {
      lVar5 = this->bytesDownloaded;
      while( true ) {
        lVar6 = (this->super_QNetworkReplyPrivate).readBufferMaxSize;
        if (lVar6 == 0) {
          lVar6 = 0x8000;
        }
        else {
          lVar3 = *(long *)&(this->super_QNetworkReplyPrivate).field_0x90;
          if (lVar3 == 0) {
            lVar3 = 0;
          }
          else {
            lVar3 = *(long *)(lVar3 + 0x18);
          }
          lVar6 = lVar6 - lVar3;
          if (lVar6 < 1) {
            lVar6 = 0;
          }
        }
        if (lVar6 == 0) goto LAB_00199e09;
        (**(code **)(*(long *)this->copyDevice + 0xa0))();
        pQVar1 = this->copyDevice;
        lVar4 = QRingBuffer::reserve(*(longlong *)&(this->super_QNetworkReplyPrivate).field_0x90);
        lVar6 = QIODevice::read((char *)pQVar1,lVar4);
        if (lVar6 == -1) {
          QRingBuffer::chop(*(longlong *)&(this->super_QNetworkReplyPrivate).field_0x90);
          goto LAB_00199e09;
        }
        QRingBuffer::chop(*(longlong *)&(this->super_QNetworkReplyPrivate).field_0x90);
        cVar2 = (**(code **)(*(long *)this->copyDevice + 0x60))();
        if ((cVar2 == '\0') &&
           (cVar2 = (**(code **)(*(long *)this->copyDevice + 0x90))(), cVar2 != '\0')) break;
        this->bytesDownloaded = this->bytesDownloaded + lVar6;
      }
      this->bytesDownloaded = this->bytesDownloaded + lVar6;
LAB_00199e09:
      if (this->bytesDownloaded != lVar5) {
        QNetworkHeadersPrivate::headers((QNetworkHeadersPrivate *)&stack0xffffffffffffffc0);
        QVar7 = QHttpHeaders::value((QHttpHeaders *)&stack0xffffffffffffffc0,ContentLength,
                                    (QByteArrayView)ZEXT816(0));
        value.m_data = QVar7.m_data;
        value.m_size = (qsizetype)value.m_data;
        oVar8 = QNetworkHeadersPrivate::toInt((QNetworkHeadersPrivate *)QVar7.m_size,value);
        QHttpHeaders::~QHttpHeaders((QHttpHeaders *)&stack0xffffffffffffffc0);
        this->notificationHandlingPaused = true;
        QIODevice::readyRead();
        cVar2 = QElapsedTimer::isValid();
        if ((cVar2 != '\0') && (lVar5 = QElapsedTimer::elapsed(), 99 < lVar5)) {
          QElapsedTimer::start();
          _t2._M_value = -1;
          if (((undefined1  [16])
               oVar8.super__Optional_base<long_long,_true,_true>._M_payload.
               super__Optional_payload_base<long_long> & (undefined1  [16])0x1) !=
              (undefined1  [16])0x0) {
            _t2._M_value = oVar8.super__Optional_base<long_long,_true,_true>._M_payload.
                           super__Optional_payload_base<long_long>._M_payload;
          }
          QNetworkReply::downloadProgress(this_00,this->bytesDownloaded,_t2._M_value);
        }
        resumeNotificationHandling(this);
      }
    }
  }
  if (*(pair<QByteArray,_QByteArray> **)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QNetworkReplyImplPrivate::_q_copyReadyRead()
{
    Q_Q(QNetworkReplyImpl);
    if (state != Working)
        return;
    if (!copyDevice || !q->isOpen())
        return;

    // FIXME Optimize to use download buffer if it is a QBuffer.
    // Needs to be done where sendCacheContents() (?) of HTTP is emitting
    // metaDataChanged ?
    qint64 lastBytesDownloaded = bytesDownloaded;
    forever {
        qint64 bytesToRead = nextDownstreamBlockSize();
        if (bytesToRead == 0)
            // we'll be called again, eventually
            break;

        bytesToRead = qBound<qint64>(1, bytesToRead, copyDevice->bytesAvailable());
        qint64 bytesActuallyRead = copyDevice->read(buffer.reserve(bytesToRead), bytesToRead);
        if (bytesActuallyRead == -1) {
            buffer.chop(bytesToRead);
            break;
        }
        buffer.chop(bytesToRead - bytesActuallyRead);

        if (!copyDevice->isSequential() && copyDevice->atEnd()) {
            bytesDownloaded += bytesActuallyRead;
            break;
        }

        bytesDownloaded += bytesActuallyRead;
    }